

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualAllocWrapper.cpp
# Opt level: O0

LPVOID __thiscall
Memory::PreReservedVirtualAllocWrapper::AllocPages
          (PreReservedVirtualAllocWrapper *this,LPVOID lpAddress,size_t pageCount,
          DWORD allocationType,DWORD protectFlags,bool isCustomHeapAllocation)

{
  code *pcVar1;
  AutoCriticalSection AVar2;
  bool bVar3;
  BOOLEAN BVar4;
  uint uVar5;
  BVIndex BVar6;
  LPVOID pvVar7;
  ulong uVar8;
  SIZE_T SVar9;
  LPVOID pvVar10;
  undefined8 *in_FS_OFFSET;
  undefined4 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  PreReservedVirtualAllocWrapper *pPStack_c0;
  bool failedToProtectPages;
  char *allocatedAddress;
  uint numOfSegments;
  size_t bytes;
  MEMORY_BASIC_INFORMATION memBasicInfo;
  uint uStack_70;
  uint offset;
  size_t requestedNumOfSegments;
  PreReservedVirtualAllocWrapper *pPStack_60;
  uint freeSegmentsBVIndex;
  char *addressToReserve;
  AutoCriticalSection local_48;
  AutoCriticalSection autocs;
  size_t dwSize;
  bool isCustomHeapAllocation_local;
  DWORD protectFlags_local;
  DWORD allocationType_local;
  size_t pageCount_local;
  LPVOID lpAddress_local;
  PreReservedVirtualAllocWrapper *this_local;
  
  if (0xfffffffffffff < pageCount) {
    return (LPVOID)0x0;
  }
  autocs.cs = (CriticalSection *)(pageCount << 0xc);
  if (!isCustomHeapAllocation) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                       ,0x119,"(isCustomHeapAllocation)",
                       "PreReservation used for allocations other than CustomHeap?");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if (autocs.cs == (CriticalSection *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                       ,0x11b,"(dwSize != 0)","dwSize != 0");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  AutoCriticalSection::AutoCriticalSection(&local_48,&this->cs);
  pvVar7 = EnsurePreReservedRegionInternal(this);
  AVar2 = autocs;
  if (pvVar7 == (LPVOID)0x0) {
    uVar5 = AutoSystemInfo::GetAllocationGranularityPageCount(&AutoSystemInfo::Data);
    Output::Trace(PreReservedHeapAllocPhase,
                  L"No space to pre-reserve memory with %d pages. Returning NULL\n",
                  (ulong)(uVar5 << 0xc));
    this_local = (PreReservedVirtualAllocWrapper *)0x0;
    goto LAB_00398d85;
  }
  requestedNumOfSegments._4_4_ = 0xffffffff;
  uVar5 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
  uVar8 = (ulong)AVar2.cs / (ulong)uVar5;
  if (0xffffffff < uVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                       ,0x12a,"(requestedNumOfSegments <= ((uint32_t)~((uint32_t)0)))",
                       "requestedNumOfSegments <= MAXUINT32");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  uStack_70 = (uint)uVar8;
  if (lpAddress == (LPVOID)0x0) {
    if (uVar8 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                         ,0x12e,"(requestedNumOfSegments != 0)","requestedNumOfSegments != 0");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    AVar2.cs = autocs.cs;
    uVar5 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
    if ((ulong)AVar2.cs % (ulong)uVar5 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                         ,0x12f,
                         "(dwSize % AutoSystemInfo::Data.GetAllocationGranularityPageSize() == 0)",
                         "dwSize should be aligned with Allocation Granularity");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    do {
      requestedNumOfSegments._4_4_ =
           BVStatic<4096UL>::GetNextBit(&this->freeSegments,requestedNumOfSegments._4_4_ + 1);
      BVar6 = BVStatic<4096UL>::Length(&this->freeSegments);
      if ((BVar6 - requestedNumOfSegments._4_4_ < uVar8) ||
         (requestedNumOfSegments._4_4_ == 0xffffffff)) {
        Output::Trace(PreReservedHeapAllocPhase,
                      L"No more space to commit in PreReserved Memory region.\n");
        this_local = (PreReservedVirtualAllocWrapper *)0x0;
        goto LAB_00398d85;
      }
      BVar4 = BVStatic<4096UL>::TestRange
                        (&this->freeSegments,requestedNumOfSegments._4_4_,uStack_70);
    } while (BVar4 == '\0');
    uVar5 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
    memBasicInfo._44_4_ = requestedNumOfSegments._4_4_ * uVar5;
    pPStack_60 = (PreReservedVirtualAllocWrapper *)
                 ((long)this->preReservedStartAddress + (ulong)(uint)memBasicInfo._44_4_);
    SVar9 = VirtualQuery(pPStack_60,(PMEMORY_BASIC_INFORMATION)&bytes,0x30);
    if (SVar9 == 0) {
      MemoryOperationLastError::RecordLastError();
    }
    else {
      uVar5 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
      if ((uVar8 * uVar5 <= (ulong)memBasicInfo._16_8_) && ((int)memBasicInfo.RegionSize != 0x1000))
      goto LAB_00398a4f;
    }
    CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
  }
  else {
    if ((lpAddress < this->preReservedStartAddress) &&
       (pvVar7 = (LPVOID)((long)lpAddress + (long)autocs.cs),
       pvVar10 = GetPreReservedEndAddress(this), pvVar10 <= pvVar7)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                         ,0x151,
                         "(((char*) lpAddress) >= (char*) preReservedStartAddress || ((char*) lpAddress + dwSize) < GetPreReservedEndAddress())"
                         ,
                         "((char*) lpAddress) >= (char*) preReservedStartAddress || ((char*) lpAddress + dwSize) < GetPreReservedEndAddress()"
                        );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    pvVar7 = this->preReservedStartAddress;
    uVar5 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
    requestedNumOfSegments._4_4_ = (BVIndex)(((long)lpAddress - (long)pvVar7) / (long)(ulong)uVar5);
    auVar13._8_4_ = (int)((ulong)autocs.cs >> 0x20);
    auVar13._0_8_ = autocs.cs;
    auVar13._12_4_ = 0x45300000;
    uVar11 = SUB84(autocs.cs,0);
    uVar5 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
    auVar12._0_8_ =
         ((auVar13._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0)) / (double)uVar5;
    auVar12._8_8_ = 0;
    auVar13 = roundsd(auVar12,auVar12,10);
    uVar5 = (uint)(long)auVar13._0_8_;
    if (uVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                         ,0x157,"(numOfSegments != 0)","numOfSegments != 0");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    BVar6 = BVStatic<4096UL>::Length(&this->freeSegments);
    if (BVar6 <= (requestedNumOfSegments._4_4_ - 1) + uVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                         ,0x158,"(freeSegmentsBVIndex + numOfSegments - 1 < freeSegments.Length())",
                         "freeSegmentsBVIndex + numOfSegments - 1 < freeSegments.Length()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    BVar4 = BVStatic<4096UL>::TestRange(&this->freeSegments,requestedNumOfSegments._4_4_,uVar5);
    pPStack_60 = (PreReservedVirtualAllocWrapper *)lpAddress;
    if (BVar4 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                         ,0x159,"(!freeSegments.TestRange(freeSegmentsBVIndex, numOfSegments))",
                         "!freeSegments.TestRange(freeSegmentsBVIndex, numOfSegments)");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
LAB_00398a4f:
  if (0xfff < requestedNumOfSegments._4_4_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                       ,0x15d,"(freeSegmentsBVIndex < PreReservedAllocationSegmentCount)",
                       "Invalid BitVector index calculation?");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if (((ulong)autocs.cs & 0xfff) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                       ,0x15e,"(dwSize % AutoSystemInfo::PageSize == 0)",
                       "COMMIT is managed at AutoSystemInfo::PageSize granularity");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if ((allocationType & 0x1000) == 0) {
    pPStack_c0 = pPStack_60;
  }
  else {
    pPStack_c0 = (PreReservedVirtualAllocWrapper *)
                 VirtualAlloc(pPStack_60,(SIZE_T)autocs.cs,0x1000,protectFlags);
    if (pPStack_c0 == (PreReservedVirtualAllocWrapper *)0x0) {
      MemoryOperationLastError::RecordLastError();
    }
  }
  if ((lpAddress == (LPVOID)0x0) && (pPStack_c0 != (PreReservedVirtualAllocWrapper *)0x0)) {
    if (pPStack_c0 != pPStack_60) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                         ,0x193,"(allocatedAddress == addressToReserve)",
                         "allocatedAddress == addressToReserve");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    if (uVar8 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                         ,0x194,"(requestedNumOfSegments != 0)","requestedNumOfSegments != 0");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    BVStatic<4096UL>::ClearRange(&this->freeSegments,requestedNumOfSegments._4_4_,uStack_70);
  }
  uVar5 = AutoSystemInfo::GetAllocationGranularityPageSize(&AutoSystemInfo::Data);
  Output::Trace(PreReservedHeapAllocPhase,
                L"MEM_COMMIT: StartAddress: 0x%p of size: 0x%x * 0x%x bytes \n",pPStack_c0,uVar8,
                (ulong)uVar5);
  this_local = pPStack_c0;
LAB_00398d85:
  AutoCriticalSection::~AutoCriticalSection(&local_48);
  return this_local;
}

Assistant:

LPVOID PreReservedVirtualAllocWrapper::AllocPages(LPVOID lpAddress, size_t pageCount,  DWORD allocationType, DWORD protectFlags, bool isCustomHeapAllocation)
{
    if (pageCount > AutoSystemInfo::MaxPageCount)
    {
        return nullptr;
    }
    size_t dwSize = pageCount * AutoSystemInfo::PageSize;

    AssertMsg(isCustomHeapAllocation, "PreReservation used for allocations other than CustomHeap?");

    Assert(dwSize != 0);

    {
        AutoCriticalSection autocs(&this->cs);
        //Return nullptr, if no space to Reserve
        if (EnsurePreReservedRegionInternal() == nullptr)
        {
            PreReservedHeapTrace(_u("No space to pre-reserve memory with %d pages. Returning NULL\n"), PreReservedAllocationSegmentCount * AutoSystemInfo::Data.GetAllocationGranularityPageCount());
            return nullptr;
        }

        char * addressToReserve = nullptr;

        uint freeSegmentsBVIndex = BVInvalidIndex;
        size_t requestedNumOfSegments = dwSize / (AutoSystemInfo::Data.GetAllocationGranularityPageSize());
        Assert(requestedNumOfSegments <= MAXUINT32);

        if (lpAddress == nullptr)
        {
            Assert(requestedNumOfSegments != 0);
            AssertMsg(dwSize % AutoSystemInfo::Data.GetAllocationGranularityPageSize() == 0, "dwSize should be aligned with Allocation Granularity");

            do
            {
                freeSegmentsBVIndex = freeSegments.GetNextBit(freeSegmentsBVIndex + 1);
                //Return nullptr, if we don't have free/decommit pages to allocate
                if ((freeSegments.Length() - freeSegmentsBVIndex < requestedNumOfSegments) ||
                    freeSegmentsBVIndex == BVInvalidIndex)
                {
                    PreReservedHeapTrace(_u("No more space to commit in PreReserved Memory region.\n"));
                    return nullptr;
                }
            } while (!freeSegments.TestRange(freeSegmentsBVIndex, static_cast<uint>(requestedNumOfSegments)));

            uint offset = freeSegmentsBVIndex * AutoSystemInfo::Data.GetAllocationGranularityPageSize();
            addressToReserve = (char*) preReservedStartAddress + offset;

            //Check if the region is not already in MEM_COMMIT state.
            MEMORY_BASIC_INFORMATION memBasicInfo;
            size_t bytes = VirtualQuery(addressToReserve, &memBasicInfo, sizeof(memBasicInfo));
            if (bytes == 0)
            {
                MemoryOperationLastError::RecordLastError();
            }
            if (bytes == 0
                || memBasicInfo.RegionSize < requestedNumOfSegments * AutoSystemInfo::Data.GetAllocationGranularityPageSize()
                || memBasicInfo.State == MEM_COMMIT)
            {
                CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
            }
        }
        else
        {
            //Check If the lpAddress is within the range of the preReserved Memory Region
            Assert(((char*) lpAddress) >= (char*) preReservedStartAddress || ((char*) lpAddress + dwSize) < GetPreReservedEndAddress());

            addressToReserve = (char*) lpAddress;
            freeSegmentsBVIndex = (uint) ((addressToReserve - (char*) preReservedStartAddress) / AutoSystemInfo::Data.GetAllocationGranularityPageSize());
#if DBG
            uint numOfSegments = (uint)ceil((double)dwSize / (double)AutoSystemInfo::Data.GetAllocationGranularityPageSize());
            Assert(numOfSegments != 0);
            Assert(freeSegmentsBVIndex + numOfSegments - 1 < freeSegments.Length());
            Assert(!freeSegments.TestRange(freeSegmentsBVIndex, numOfSegments));
#endif
        }

        AssertMsg(freeSegmentsBVIndex < PreReservedAllocationSegmentCount, "Invalid BitVector index calculation?");
        AssertMsg(dwSize % AutoSystemInfo::PageSize == 0, "COMMIT is managed at AutoSystemInfo::PageSize granularity");

        char * allocatedAddress = nullptr;
        bool failedToProtectPages = false;

        if ((allocationType & MEM_COMMIT) != 0)
        {
#if defined(ENABLE_JIT_CLAMP)
            AutoEnableDynamicCodeGen enableCodeGen;
#endif

#if defined(_CONTROL_FLOW_GUARD)
            if (GlobalSecurityPolicy::IsCFGEnabled())
            {
                DWORD oldProtect = 0;
                DWORD allocProtectFlags = 0;

                allocProtectFlags = PAGE_EXECUTE_RW_TARGETS_INVALID;

                allocatedAddress = (char *)VirtualAlloc(addressToReserve, dwSize, MEM_COMMIT, allocProtectFlags);
                if (allocatedAddress != nullptr)
                {
                    BOOL result = VirtualProtect(allocatedAddress, dwSize, protectFlags, &oldProtect);
                    if (result == FALSE)
                    {
                        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
                    }
                    AssertMsg(oldProtect == (PAGE_EXECUTE_READWRITE), "CFG Bitmap gets allocated and bits will be set to invalid only upon passing these flags.");
                }
                else
                {
                    MemoryOperationLastError::RecordLastError();
                }
            }
            else
#endif
            {
                allocatedAddress = (char *)VirtualAlloc(addressToReserve, dwSize, MEM_COMMIT, protectFlags);
                if (allocatedAddress == nullptr)
                {
                    MemoryOperationLastError::RecordLastError();
                }
            }
        }
        else
        {
            // Just return the uncommitted address if we didn't ask to commit it.
            allocatedAddress = addressToReserve;
        }

        // Keep track of the committed pages within the preReserved Memory Region
        if (lpAddress == nullptr && allocatedAddress != nullptr)
        {
            Assert(allocatedAddress == addressToReserve);
            Assert(requestedNumOfSegments != 0);
            freeSegments.ClearRange(freeSegmentsBVIndex, static_cast<uint>(requestedNumOfSegments));
        }

        PreReservedHeapTrace(_u("MEM_COMMIT: StartAddress: 0x%p of size: 0x%x * 0x%x bytes \n"), allocatedAddress, requestedNumOfSegments, AutoSystemInfo::Data.GetAllocationGranularityPageSize());
        if (failedToProtectPages)
        {
            return nullptr;
        }
        return allocatedAddress;
    }
}